

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O0

l2_expr_info *
l2_eval_expr_lshift_rshift_rshift_unsigned1
          (l2_expr_info *__return_storage_ptr__,l2_scope *scope_p,l2_expr_info left_expr_info)

{
  l2_expr_info left_expr_info_00;
  l2_expr_info left_expr_info_01;
  l2_expr_info lVar1;
  boolean bVar2;
  uint uVar3;
  l2_expr_info local_90;
  l2_expr_info local_78;
  l2_expr_info local_60;
  l2_token *local_48;
  l2_token *current_token_p;
  l2_expr_info new_left_expr_info;
  l2_expr_info right_expr_info;
  l2_scope *scope_p_local;
  
  lVar1 = left_expr_info;
  bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_LSHIFT);
  if (bVar2 == '\0') {
    bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_RSHIFT);
    if (bVar2 == '\0') {
      bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_RSHIFT_UNSIGNED);
      if (bVar2 == '\0') {
        __return_storage_ptr__->val_type = left_expr_info.val_type;
        *(undefined4 *)&__return_storage_ptr__->field_0x4 = left_expr_info._4_4_;
        (__return_storage_ptr__->val).real = left_expr_info.val.real;
        left_expr_info.val.procedure.upper_scope_p = lVar1.val._8_8_;
        (__return_storage_ptr__->val).procedure.upper_scope_p =
             left_expr_info.val.procedure.upper_scope_p;
      }
      else {
        l2_parse_token_forward();
        local_48 = l2_parse_token_current();
        l2_eval_expr_plus_sub(&local_90,scope_p);
        new_left_expr_info.val._8_4_ = local_90.val_type;
        new_left_expr_info.val._12_4_ = local_90._4_4_;
        current_token_p._0_4_ = 2;
        if (left_expr_info.val_type != L2_EXPR_VAL_TYPE_INTEGER) {
          if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
            if (local_90.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
              l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                               local_48->current_line,local_48->current_col,">>>","real","integer");
            }
            if (local_90.val_type != L2_EXPR_VAL_TYPE_REAL) {
              if (local_90.val_type != L2_EXPR_VAL_TYPE_BOOL) {
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_48->current_line,
                                 local_48->current_col);
              }
              l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                               local_48->current_line,local_48->current_col,">>>","real","bool");
            }
            l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                             local_48->current_line,local_48->current_col,">>>","real");
          }
          if (left_expr_info.val_type != L2_EXPR_VAL_TYPE_BOOL) {
            l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_48->current_line,
                             local_48->current_col);
          }
          if (local_90.val_type != L2_EXPR_VAL_TYPE_INTEGER) {
            if (local_90.val_type == L2_EXPR_VAL_TYPE_REAL) {
              l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                               local_48->current_line,local_48->current_col,">>>","bool","real");
            }
            if (local_90.val_type != L2_EXPR_VAL_TYPE_BOOL) {
              l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_48->current_line,
                               local_48->current_col);
            }
            l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                             local_48->current_line,local_48->current_col,">>>","bool");
          }
          l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                           local_48->current_line,local_48->current_col,">>>","bool","integer");
        }
        if (local_90.val_type != L2_EXPR_VAL_TYPE_INTEGER) {
          if (local_90.val_type == L2_EXPR_VAL_TYPE_REAL) {
            l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                             local_48->current_line,local_48->current_col,">>>","integer","real");
          }
          if (local_90.val_type != L2_EXPR_VAL_TYPE_BOOL) {
            l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_48->current_line,
                             local_48->current_col);
          }
          l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                           local_48->current_line,local_48->current_col,">>>","integer","bool");
        }
        uVar3 = left_expr_info.val._0_4_ >> (local_90.val.bool & 0x1fU);
        new_left_expr_info._0_8_ = ZEXT48(uVar3);
        lVar1._4_4_ = current_token_p._4_4_;
        lVar1.val_type = 2;
        lVar1.val.procedure.entry_pos = uVar3;
        lVar1.val.integer._4_4_ = 0;
        lVar1.val._8_8_ = new_left_expr_info.val.real;
        l2_eval_expr_lshift_rshift_rshift_unsigned1(__return_storage_ptr__,scope_p,lVar1);
      }
    }
    else {
      l2_parse_token_forward();
      local_48 = l2_parse_token_current();
      l2_eval_expr_plus_sub(&local_78,scope_p);
      new_left_expr_info.val._8_4_ = local_78.val_type;
      new_left_expr_info.val._12_4_ = local_78._4_4_;
      current_token_p._0_4_ = 2;
      if (left_expr_info.val_type != L2_EXPR_VAL_TYPE_INTEGER) {
        if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
          if (local_78.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
            l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                             local_48->current_line,local_48->current_col,">>","real","integer");
          }
          if (local_78.val_type != L2_EXPR_VAL_TYPE_REAL) {
            if (local_78.val_type != L2_EXPR_VAL_TYPE_BOOL) {
              l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_48->current_line,
                               local_48->current_col);
            }
            l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                             local_48->current_line,local_48->current_col,">>","real","bool");
          }
          l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                           local_48->current_line,local_48->current_col,">>","real");
        }
        if (left_expr_info.val_type != L2_EXPR_VAL_TYPE_BOOL) {
          l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_48->current_line,
                           local_48->current_col);
        }
        if (local_78.val_type != L2_EXPR_VAL_TYPE_INTEGER) {
          if (local_78.val_type == L2_EXPR_VAL_TYPE_REAL) {
            l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                             local_48->current_line,local_48->current_col,">>","bool","real");
          }
          if (local_78.val_type != L2_EXPR_VAL_TYPE_BOOL) {
            l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_48->current_line,
                             local_48->current_col);
          }
          l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                           local_48->current_line,local_48->current_col,">>","bool");
        }
        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                         local_48->current_line,local_48->current_col,">>","bool","integer");
      }
      if (local_78.val_type != L2_EXPR_VAL_TYPE_INTEGER) {
        if (local_78.val_type == L2_EXPR_VAL_TYPE_REAL) {
          l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                           local_48->current_line,local_48->current_col,">>","integer","real");
        }
        if (local_78.val_type != L2_EXPR_VAL_TYPE_BOOL) {
          l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_48->current_line,
                           local_48->current_col);
        }
        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                         local_48->current_line,local_48->current_col,">>","integer","bool");
      }
      new_left_expr_info._0_8_ = left_expr_info.val.integer >> (local_78.val.bool & 0x3fU);
      left_expr_info_01._4_4_ = current_token_p._4_4_;
      left_expr_info_01.val_type = 2;
      left_expr_info_01.val.integer = new_left_expr_info._0_8_;
      left_expr_info_01.val._8_8_ = new_left_expr_info.val.real;
      l2_eval_expr_lshift_rshift_rshift_unsigned1(__return_storage_ptr__,scope_p,left_expr_info_01);
    }
  }
  else {
    l2_parse_token_forward();
    local_48 = l2_parse_token_current();
    l2_eval_expr_plus_sub(&local_60,scope_p);
    new_left_expr_info.val._8_4_ = local_60.val_type;
    new_left_expr_info.val._12_4_ = local_60._4_4_;
    current_token_p._0_4_ = 2;
    if (left_expr_info.val_type != L2_EXPR_VAL_TYPE_INTEGER) {
      if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
        if (local_60.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
          l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                           local_48->current_line,local_48->current_col,"<<","real","integer");
        }
        if (local_60.val_type != L2_EXPR_VAL_TYPE_REAL) {
          if (local_60.val_type != L2_EXPR_VAL_TYPE_BOOL) {
            l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_48->current_line,
                             local_48->current_col);
          }
          l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                           local_48->current_line,local_48->current_col,"<<","real","bool");
        }
        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                         local_48->current_line,local_48->current_col,"<<","real");
      }
      if (left_expr_info.val_type != L2_EXPR_VAL_TYPE_BOOL) {
        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_48->current_line,
                         local_48->current_col);
      }
      if (local_60.val_type != L2_EXPR_VAL_TYPE_INTEGER) {
        if (local_60.val_type == L2_EXPR_VAL_TYPE_REAL) {
          l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                           local_48->current_line,local_48->current_col,"<<","bool","real");
        }
        if (local_60.val_type != L2_EXPR_VAL_TYPE_BOOL) {
          l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_48->current_line,
                           local_48->current_col);
        }
        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                         local_48->current_line,local_48->current_col,"<<","bool");
      }
      l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                       local_48->current_line,local_48->current_col,"<<","bool","integer");
    }
    if (local_60.val_type != L2_EXPR_VAL_TYPE_INTEGER) {
      if (local_60.val_type == L2_EXPR_VAL_TYPE_REAL) {
        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                         local_48->current_line,local_48->current_col,"<<","integer","real");
      }
      if (local_60.val_type != L2_EXPR_VAL_TYPE_BOOL) {
        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_48->current_line,
                         local_48->current_col);
      }
      l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                       local_48->current_line,local_48->current_col,"<<","integer","bool");
    }
    new_left_expr_info._0_8_ = left_expr_info.val.integer << (local_60.val.bool & 0x3fU);
    left_expr_info_00._4_4_ = current_token_p._4_4_;
    left_expr_info_00.val_type = 2;
    left_expr_info_00.val.integer = new_left_expr_info._0_8_;
    left_expr_info_00.val._8_8_ = new_left_expr_info.val.real;
    l2_eval_expr_lshift_rshift_rshift_unsigned1(__return_storage_ptr__,scope_p,left_expr_info_00);
  }
  return __return_storage_ptr__;
}

Assistant:

l2_expr_info l2_eval_expr_lshift_rshift_rshift_unsigned1(l2_scope *scope_p, l2_expr_info left_expr_info) {
    l2_expr_info right_expr_info, new_left_expr_info;
    _declr_current_token_p

    _if_type (L2_TOKEN_LSHIFT) /* << */
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_plus_sub(scope_p);
        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
        switch (left_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val.integer = (left_expr_info.val.integer << right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "integer", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "integer", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "bool", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "bool", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "bool", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "real", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "real", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "real", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return l2_eval_expr_lshift_rshift_rshift_unsigned1(scope_p, new_left_expr_info);

    }
    _elif_type (L2_TOKEN_RSHIFT) /* >> */
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_plus_sub(scope_p);
        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
        switch (left_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val.integer = (left_expr_info.val.integer >> right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "integer", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "integer", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "bool", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "bool", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "bool", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "real", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "real", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "real", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return l2_eval_expr_lshift_rshift_rshift_unsigned1(scope_p, new_left_expr_info);

    }
    _elif_type (L2_TOKEN_RSHIFT_UNSIGNED) /* >>> */
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_plus_sub(scope_p);
        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
        switch (left_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val.integer = (((unsigned int)left_expr_info.val.integer) >> right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "integer", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "integer", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "bool", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "bool", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "bool", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "real", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "real", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "real", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return l2_eval_expr_lshift_rshift_rshift_unsigned1(scope_p, new_left_expr_info);

    }
    _else
    {
        return left_expr_info;
    }
}